

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsnprintf.c
# Opt level: O3

int vsnprintf(char *__s,size_t __maxlen,char *__format,__gnuc_va_list __arg)

{
  char *spec;
  _PDCLIB_status_t local_78;
  
  local_78.base = 0;
  local_78.flags = 0;
  local_78.i = 0;
  local_78.current = 0;
  local_78.width = 0;
  local_78.prec = -1;
  local_78.stream = (_PDCLIB_file_t *)0x0;
  local_78.arg[0]._0_8_ = *__arg;
  local_78.arg[0].overflow_arg_area = *(void **)((long)__arg + 8);
  local_78.arg[0].reg_save_area = *(void **)((long)__arg + 0x10);
  local_78.n = __maxlen;
  local_78.s = __s;
LAB_00104f0c:
  spec = __format;
  if (*spec == '%') goto LAB_00104f1d;
  if (*spec == '\0') {
    if (local_78.i < __maxlen) {
      __s[local_78.i] = '\0';
    }
    return (int)local_78.i;
  }
  goto LAB_00104f2d;
LAB_00104f1d:
  __format = _PDCLIB_print(spec,&local_78);
  if (__format == spec) {
LAB_00104f2d:
    if (local_78.i < __maxlen) {
      __s[local_78.i] = *spec;
    }
    local_78.i = local_78.i + 1;
    __format = spec + 1;
  }
  goto LAB_00104f0c;
}

Assistant:

int vsnprintf( char * _PDCLIB_restrict s, size_t n, const char * _PDCLIB_restrict format, _PDCLIB_va_list arg )
{
    /* TODO: This function should interpret format as multibyte characters.  */
    struct _PDCLIB_status_t status;
    status.base = 0;
    status.flags = 0;
    status.n = n;
    status.i = 0;
    status.current = 0;
    status.s = s;
    status.width = 0;
    status.prec = EOF;
    status.stream = NULL;
    va_copy( status.arg, arg );

    while ( *format != '\0' )
    {
        const char * rc;

        if ( ( *format != '%' ) || ( ( rc = _PDCLIB_print( format, &status ) ) == format ) )
        {
            /* No conversion specifier, print verbatim */
            if ( status.i < n )
            {
                s[ status.i ] = *format;
            }

            status.i++;
            format++;
        }
        else
        {
            /* Continue parsing after conversion specifier */
            format = rc;
        }
    }

    if ( status.i  < n )
    {
        s[ status.i ] = '\0';
    }

    va_end( status.arg );
    return status.i;
}